

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BaseCase::verifyMessageGroup
          (BaseCase *this,MessageData *message,GLenum source,GLenum type)

{
  MessageBuilder *pMVar1;
  Enum<int,_2UL> EVar2;
  Enum<int,_2UL> local_3f8;
  GetNameFunc local_3e8;
  int local_3e0;
  Enum<int,_2UL> local_3d8;
  MessageBuilder local_3c8;
  allocator<char> local_241;
  string local_240;
  GetNameFunc local_220;
  int local_218;
  Enum<int,_2UL> local_210;
  GetNameFunc local_200;
  int local_1f8;
  Enum<int,_2UL> local_1f0;
  MessageBuilder local_1e0;
  allocator<char> local_49;
  string local_48;
  TestLog *local_28;
  TestLog *log;
  GLenum type_local;
  GLenum source_local;
  MessageData *message_local;
  BaseCase *this_local;
  
  log._0_4_ = type;
  log._4_4_ = source;
  _type_local = message;
  message_local = (MessageData *)this;
  local_28 = tcu::TestContext::getLog
                       ((this->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
  if ((_type_local->id).source != log._4_4_) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Incorrect message source",&local_49);
    tcu::ResultCollector::addResult(&this->m_results,QP_TEST_RESULT_FAIL,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    tcu::TestLog::operator<<(&local_1e0,local_28,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_1e0,(char (*) [20])"Message source was ");
    EVar2 = glu::getDebugMessageSourceStr((_type_local->id).source);
    local_200 = EVar2.m_getName;
    local_1f8 = EVar2.m_value;
    local_1f0.m_getName = local_200;
    local_1f0.m_value = local_1f8;
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_1f0);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [27])" when it should have been ");
    EVar2 = glu::getDebugMessageSourceStr(log._4_4_);
    local_220 = EVar2.m_getName;
    local_218 = EVar2.m_value;
    local_210.m_getName = local_220;
    local_210.m_value = local_218;
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_210);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e0);
  }
  if ((_type_local->id).type != (GLenum)log) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,"Incorrect message type",&local_241);
    tcu::ResultCollector::addResult(&this->m_results,QP_TEST_RESULT_FAIL,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    tcu::TestLog::operator<<(&local_3c8,local_28,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_3c8,(char (*) [18])"Message type was ");
    EVar2 = glu::getDebugMessageTypeStr((_type_local->id).type);
    local_3e8 = EVar2.m_getName;
    local_3e0 = EVar2.m_value;
    local_3d8.m_getName = local_3e8;
    local_3d8.m_value = local_3e0;
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_3d8);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [27])" when it should have been ");
    EVar2 = glu::getDebugMessageTypeStr((GLenum)log);
    local_3f8.m_getName = EVar2.m_getName;
    local_3f8.m_value = EVar2.m_value;
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_3f8);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3c8);
  }
  return;
}

Assistant:

void BaseCase::verifyMessageGroup (const MessageData& message, GLenum source, GLenum type)
{
	TestLog& log = m_testCtx.getLog();

	if (message.id.source != source)
	{
		m_results.addResult(QP_TEST_RESULT_FAIL, "Incorrect message source");
		log << TestLog::Message << "Message source was " << glu::getDebugMessageSourceStr(message.id.source)
			<< " when it should have been "  << glu::getDebugMessageSourceStr(source) << TestLog::EndMessage;
	}

	if (message.id.type != type)
	{
		m_results.addResult(QP_TEST_RESULT_FAIL, "Incorrect message type");
		log << TestLog::Message << "Message type was " << glu::getDebugMessageTypeStr(message.id.type)
			<< " when it should have been " << glu::getDebugMessageTypeStr(type) << TestLog::EndMessage;
	}
}